

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
* __thiscall
capnproto_test::capnp::test::TestInterface::Client::bazRequest
          (Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  _func_int *p_Var1;
  Maybe<capnp::MessageSize> local_38;
  Maybe<capnp::MessageSize> *local_20;
  Maybe<capnp::MessageSize> *sizeHint_local;
  Client *this_local;
  
  p_Var1 = this->_vptr_Client[-3];
  local_20 = sizeHint;
  sizeHint_local = (Maybe<capnp::MessageSize> *)this;
  this_local = (Client *)__return_storage_ptr__;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_38,sizeHint);
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestInterface::BazParams,capnproto_test::capnp::test::TestInterface::BazResults>
            (__return_storage_ptr__,(Client *)((long)&this->_vptr_Client + (long)p_Var1),
             0x88eb12a0e0af92b2,2,&local_38,(CallHints)0x1);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_38);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestInterface::BazParams,  ::capnproto_test::capnp::test::TestInterface::BazResults>
TestInterface::Client::bazRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestInterface::BazParams,  ::capnproto_test::capnp::test::TestInterface::BazResults>(
      0x88eb12a0e0af92b2ull, 2, sizeHint, {true});
}